

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetNumPrecSolves(void *kinmem,long *npsolves)

{
  KINLsMem pKStack_30;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  long *npsolves_local;
  void *kinmem_local;
  
  kin_mem = (KINMem)npsolves;
  npsolves_local = (long *)kinmem;
  kinmem_local._4_4_ =
       kinLs_AccessLMem(kinmem,"KINGetNumPrecSolves",(KINMem *)&kinls_mem,&stack0xffffffffffffffd0);
  if (kinmem_local._4_4_ == 0) {
    kin_mem->kin_uround = (realtype)pKStack_30->nps;
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINGetNumPrecSolves(void *kinmem, long int *npsolves)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, "KINGetNumPrecSolves",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);
  *npsolves = kinls_mem->nps;
  return(KINLS_SUCCESS);
}